

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O1

void make_bins(float32 *values,uint32 values_num,float32 *centers,uint32 bins)

{
  float *pfVar1;
  float32 *pfVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float32 fVar7;
  
  qsort(values,(ulong)values_num,4,weights_comparator);
  if (bins != 0) {
    pfVar2 = values;
    uVar4 = 0;
    do {
      uVar5 = uVar4 + 1;
      pfVar1 = (float *)(values + (uVar5 * values_num) / (ulong)bins);
      lVar3 = (long)pfVar1 - (long)pfVar2;
      if (lVar3 == 0) {
        fVar7 = -2.139095e+09;
        if (uVar4 != 0) {
          fVar7 = centers[-1];
        }
      }
      else {
        fVar6 = 0.0;
        do {
          fVar6 = fVar6 + (float)*pfVar2;
          pfVar2 = (float32 *)((float *)pfVar2 + 1);
        } while (pfVar2 != (float32 *)pfVar1);
        fVar7 = (float32)(fVar6 / (float)(lVar3 >> 2));
      }
      *centers = fVar7;
      centers = centers + 1;
      pfVar2 = (float32 *)pfVar1;
      uVar4 = uVar5;
    } while (uVar5 != bins);
  }
  return;
}

Assistant:

static void
make_bins(float32 *values, uint32 values_num, float32 *centers, uint32 bins)
{
    float32 *finish, *start;
    uint32 i;

    qsort(values, values_num, sizeof(*values), &weights_comparator);
    start = values;
    for (i = 0; i < bins; i++, centers++, start = finish) {
        finish = values + (size_t) ((uint64) values_num * (i + 1) / bins);
        if (finish == start) {
            /* zero length bucket. */
            *centers = i ? *(centers - 1) : -FLOAT_INF;
        }
        else {
            float32 sum = 0.0f;
            float32 *ptr;
            for (ptr = start; ptr != finish; ptr++) {
                sum += *ptr;
            }
            *centers = sum / (float32) (finish - start);
        }
    }
}